

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::leSI64x2(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *other_00;
  Type *__return_storage_ptr___00;
  bool bVar1;
  long lVar2;
  Literal *pLVar3;
  undefined1 local_e0 [8];
  LaneArray<2> other_lanes;
  undefined1 local_98 [8];
  LaneArray<2> lanes;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  local_38 = __return_storage_ptr__;
  getLanesI64x2((LaneArray<2> *)local_98,this);
  getLanesI64x2((LaneArray<2> *)local_e0,other);
  __return_storage_ptr___00 = &other_lanes._M_elems[1].type;
  other_00 = &lanes._M_elems[1].type;
  for (lVar2 = 0; pLVar3 = local_38, lVar2 != 0x30; lVar2 = lVar2 + 0x18) {
    pLVar3 = (Literal *)(local_98 + lVar2);
    leS((Literal *)__return_storage_ptr___00,pLVar3,(Literal *)(local_e0 + lVar2));
    local_50.i32 = 1;
    local_40 = 2;
    bVar1 = operator==((Literal *)__return_storage_ptr___00,(Literal *)&local_50.func);
    lanes._M_elems[1].type.id = -(ulong)bVar1;
    if (pLVar3 != (Literal *)other_00) {
      ~Literal(pLVar3);
      Literal(pLVar3,(Literal *)other_00);
    }
    ~Literal((Literal *)other_00);
    ~Literal((Literal *)&local_50.func);
    ~Literal((Literal *)__return_storage_ptr___00);
  }
  Literal(local_38,(LaneArray<2> *)local_98);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_e0);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_98);
  return pLVar3;
}

Assistant:

Literal Literal::leSI64x2(const Literal& other) const {
  return compare<2, &Literal::getLanesI64x2, &Literal::leS, int64_t>(*this,
                                                                     other);
}